

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O0

void __thiscall iqxmlrpc::anon_unknown_7::ArrayBuilder::~ArrayBuilder(ArrayBuilder *this)

{
  ArrayBuilder *this_local;
  
  ValueBuilderBase::~ValueBuilderBase(&this->super_ValueBuilderBase);
  return;
}

Assistant:

ArrayBuilder(Parser& parser):
    ValueBuilderBase(parser),
    state_(parser, NONE),
    proxy_(0)
  {
    static const StateMachine::StateTransition trans[] = {
      { NONE, DATA, "data" },
      { DATA, VALUES, "value" },
      { VALUES, VALUES, "value" },
      { 0, 0, 0 }
    };
    state_.set_transitions(trans);
    retval.reset(proxy_ = new Array());
  }